

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  Biquad *pBVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  int iVar7;
  bool bVar8;
  long lVar9;
  DirectFormII *pDVar10;
  double *pdVar11;
  Biquad (*__range3) [2];
  double *pdVar12;
  CascadeStages<2,_Iir::DirectFormII> *pCVar13;
  CascadeStages<2,_Iir::DirectFormII> *pCVar14;
  Biquad *__end0;
  double dVar15;
  double dVar16;
  double dVar17;
  SOSCascade<2,_Iir::DirectFormII> f;
  double coeff [2] [6];
  double dStack_128;
  double *pdStack_120;
  Biquad *pBStack_118;
  CascadeStages<2,_Iir::DirectFormII> local_108;
  double local_88 [6];
  double local_58 [6];
  
  pCVar13 = &local_108;
  pdVar11 = (double *)&DAT_00103030;
  pdVar12 = local_88;
  for (lVar9 = 0xc; lVar9 != 0; lVar9 = lVar9 + -1) {
    *pdVar12 = *pdVar11;
    pdVar11 = pdVar11 + 1;
    pdVar12 = pdVar12 + 1;
  }
  pBVar1 = local_108.m_stages + 1;
  lVar9 = 0;
  do {
    *(undefined8 *)((long)&local_108.m_stages[0].m_a0 + lVar9) = 0x3ff0000000000000;
    *(undefined8 *)((long)&local_108.m_stages[0].m_a1 + lVar9) = 0;
    *(undefined8 *)((long)&local_108.m_stages[0].m_a2 + lVar9) = 0;
    *(undefined8 *)((long)&local_108.m_stages[0].m_b1 + lVar9) = 0;
    *(undefined8 *)((long)&local_108.m_stages[0].m_b2 + lVar9) = 0;
    *(undefined8 *)((long)&local_108.m_stages[0].m_b0 + lVar9) = 0x3ff0000000000000;
    lVar9 = lVar9 + 0x30;
  } while (lVar9 != 0x60);
  local_108.m_states[1].m_v1 = 0.0;
  local_108.m_states[1].m_v2 = 0.0;
  local_108.m_states[0].m_v1 = 0.0;
  local_108.m_states[0].m_v2 = 0.0;
  pdVar12 = local_88;
  Iir::CascadeStages<2,_Iir::DirectFormII>::setup(&local_108,(double (*) [2] [6])local_88);
  pdVar11 = local_88;
  pCVar14 = &local_108;
  bVar6 = true;
  do {
    bVar8 = bVar6;
    if ((pCVar14->m_stages[0].m_a0 != pdVar11[3]) ||
       (NAN(pCVar14->m_stages[0].m_a0) || NAN(pdVar11[3]))) {
      main_cold_9();
LAB_00101644:
      main_cold_8();
LAB_00101649:
      main_cold_6();
LAB_0010164e:
      main_cold_7();
LAB_00101653:
      main_cold_5();
LAB_00101658:
      main_cold_4();
      goto LAB_0010165d;
    }
    if ((pCVar14->m_stages[0].m_a1 != pdVar11[4]) ||
       (NAN(pCVar14->m_stages[0].m_a1) || NAN(pdVar11[4]))) goto LAB_00101644;
    if ((pCVar14->m_stages[0].m_a2 != pdVar11[5]) ||
       (NAN(pCVar14->m_stages[0].m_a2) || NAN(pdVar11[5]))) goto LAB_0010164e;
    if ((pCVar14->m_stages[0].m_b0 != *pdVar11) || (NAN(pCVar14->m_stages[0].m_b0) || NAN(*pdVar11))
       ) goto LAB_00101649;
    if ((pCVar14->m_stages[0].m_b1 != pdVar11[1]) ||
       (NAN(pCVar14->m_stages[0].m_b1) || NAN(pdVar11[1]))) goto LAB_00101653;
    if ((pCVar14->m_stages[0].m_b2 != pdVar11[2]) ||
       (NAN(pCVar14->m_stages[0].m_b2) || NAN(pdVar11[2]))) goto LAB_00101658;
    iVar7 = 0;
    pdVar11 = local_58;
    pCVar14 = (CascadeStages<2,_Iir::DirectFormII> *)pBVar1;
    bVar6 = false;
  } while (bVar8);
  dVar15 = 0.0;
  while( true ) {
    dVar16 = 1.0;
    if (iVar7 != 10) {
      dVar16 = 0.0;
    }
    lVar9 = 0x28;
    pDVar10 = local_108.m_states;
    do {
      dVar2 = pDVar10->m_v1;
      dVar3 = pDVar10->m_v2;
      dVar17 = (dVar16 - *(double *)((long)&dStack_128 + lVar9) * dVar2) -
               *(double *)((long)&pdStack_120 + lVar9) * dVar3;
      dVar16 = *(double *)((long)&pBStack_118 + lVar9);
      dVar4 = *(double *)((long)&local_108.m_stages[0].m_a0 + lVar9);
      dVar5 = *(double *)((long)local_108.m_stages + lVar9 + -8);
      pDVar10->m_v2 = dVar2;
      pDVar10->m_v1 = dVar17;
      dVar16 = dVar3 * dVar5 + dVar4 * dVar17 + dVar16 * dVar2;
      lVar9 = lVar9 + 0x30;
      pDVar10 = pDVar10 + 1;
    } while (lVar9 != 0x88);
    if (NAN(dVar16)) break;
    if ((((iVar7 - 0x15U < 0x4f) && (dVar15 == 0.0)) && (!NAN(dVar15))) &&
       ((dVar16 == 0.0 && (!NAN(dVar16))))) goto LAB_00101662;
    iVar7 = iVar7 + 1;
    dVar15 = dVar16;
    if (iVar7 == 10000) {
      main_cold_1();
      return 0;
    }
  }
LAB_0010165d:
  main_cold_3();
LAB_00101662:
  main_cold_2();
  lVar9 = 0;
  bVar6 = true;
  pdStack_120 = pdVar11;
  pBStack_118 = pCVar14->m_stages;
  do {
    bVar8 = bVar6;
    dStack_128 = 5.20932441596448e-318;
    Iir::Biquad::setCoefficients
              ((Biquad *)((long)pCVar13 + lVar9 * 0x30),pdVar12[lVar9 * 6 + 3],
               pdVar12[lVar9 * 6 + 4],pdVar12[lVar9 * 6 + 5],pdVar12[lVar9 * 6],
               pdVar12[lVar9 * 6 + 1],pdVar12[lVar9 * 6 + 2]);
    lVar9 = 1;
    bVar6 = false;
  } while (bVar8);
  return 1;
}

Assistant:

int main (int,char**)
{
	// generated with: "elliptic_design.py"
	const double coeff[][6] = {
		{1.665623674062209972e-02,
		 -3.924801366970616552e-03,
		 1.665623674062210319e-02,
		 1.000000000000000000e+00,
		 -1.715403014004022175e+00,
		 8.100474793174089472e-01},
		{1.000000000000000000e+00,
		 -1.369778997100624895e+00,
		 1.000000000000000222e+00,
		 1.000000000000000000e+00,
		 -1.605878925999785656e+00,
		 9.538657786383895054e-01}};

	Iir::Custom::SOSCascade<2> f(coeff);

	auto coeffRet = f.getCascadeStorage();
	for(int i = 0; i < 2; i++) {
	    assert_print(coeffRet.stageArray[i].m_a0 == coeff[i][3],"m_a0 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_a1 == coeff[i][4],"m_a1 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_a2 == coeff[i][5],"m_a2 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_b0 == coeff[i][0],"m_b0 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_b1 == coeff[i][1],"m_b1 mismatch.\n");
	    assert_print(coeffRet.stageArray[i].m_b2 == coeff[i][2],"m_b2 mismatch.\n");
	}

	double b = 0;
	double b2 = 0;
	for(int i=0;i<10000;i++) 
	{
		double a=0;
		if (i==10) a = 1;
		b2 = b;
		b = f.filter(a);
		assert_print(!isnan(b),"Custom filter output is NAN\n");
		if ((i>20) && (i<100)) {
			assert_print((b != 0) || (b2 != 0),
				     "Custom output is zero\n");
		}
	}
	fprintf(stderr,"Final filter value: %e\n",b);
	assert_print(fabs(b) < 1E-25,"Custom filter value for t->inf to high!");

	return 0;
}